

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

ConstantsList * alloc_constant_listitem(Context *ctx)

{
  ConstantsList *item;
  Context *ctx_local;
  
  ctx_local = (Context *)Malloc(ctx,0x20);
  if (ctx_local == (Context *)0x0) {
    ctx_local = (Context *)0x0;
  }
  else {
    memset(ctx_local,0,0x18);
    ctx_local->malloc_data = ctx->constants;
    ctx->constants = (ConstantsList *)ctx_local;
    ctx->constant_count = ctx->constant_count + 1;
  }
  return (ConstantsList *)ctx_local;
}

Assistant:

static ConstantsList *alloc_constant_listitem(Context *ctx)
{
    ConstantsList *item = (ConstantsList *) Malloc(ctx, sizeof (ConstantsList));
    if (item == NULL)
        return NULL;

    memset(&item->constant, '\0', sizeof (MOJOSHADER_constant));
    item->next = ctx->constants;
    ctx->constants = item;
    ctx->constant_count++;

    return item;
}